

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O2

CURLMcode Curl_pipeline_set_server_blacklist(char **servers,curl_llist **list_ptr)

{
  curl_llist *list;
  int iVar1;
  curl_llist *list_00;
  char *p;
  CURLMcode CVar2;
  
  list = *list_ptr;
  if (servers == (char **)0x0) {
    list_00 = (curl_llist *)0x0;
LAB_00138c60:
    if (list != (curl_llist *)0x0) {
      Curl_llist_destroy(list,(void *)0x0);
    }
    *list_ptr = list_00;
    CVar2 = CURLM_OK;
  }
  else {
    list_00 = Curl_llist_alloc(server_blacklist_llist_dtor);
    CVar2 = CURLM_OUT_OF_MEMORY;
    if (list_00 != (curl_llist *)0x0) {
      do {
        if (*servers == (char *)0x0) goto LAB_00138c60;
        p = (*Curl_cstrdup)(*servers);
        if (p == (char *)0x0) {
          Curl_llist_destroy(list_00,(void *)0x0);
          return CURLM_OUT_OF_MEMORY;
        }
        iVar1 = Curl_llist_insert_next(list_00,list_00->tail,p);
        servers = servers + 1;
      } while (iVar1 != 0);
      Curl_llist_destroy(list_00,(void *)0x0);
      (*Curl_cfree)(p);
    }
  }
  return CVar2;
}

Assistant:

CURLMcode Curl_pipeline_set_server_blacklist(char **servers,
                                             struct curl_llist **list_ptr)
{
  struct curl_llist *old_list = *list_ptr;
  struct curl_llist *new_list = NULL;

  if(servers) {
    new_list = Curl_llist_alloc((curl_llist_dtor) server_blacklist_llist_dtor);
    if(!new_list)
      return CURLM_OUT_OF_MEMORY;

    /* Parse the URLs and populate the list */
    while(*servers) {
      char *server_name;

      server_name = strdup(*servers);
      if(!server_name) {
        Curl_llist_destroy(new_list, NULL);
        return CURLM_OUT_OF_MEMORY;
      }

      if(!Curl_llist_insert_next(new_list, new_list->tail, server_name)) {
        Curl_llist_destroy(new_list, NULL);
        Curl_safefree(server_name);
        return CURLM_OUT_OF_MEMORY;
      }

      servers++;
    }
  }

  /* Free the old list */
  if(old_list) {
    Curl_llist_destroy(old_list, NULL);
  }

  /* This might be NULL if sites == NULL, i.e the blacklist is cleared */
  *list_ptr = new_list;

  return CURLM_OK;
}